

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O2

RC __thiscall QL_NodeRel::RetrieveNextRec(QL_NodeRel *this,RM_Record *rec,char **recData)

{
  int iVar1;
  RC RVar2;
  bool bVar3;
  RID rid;
  RID local_30;
  
  if (this->useIndex == true) {
    RID::RID(&local_30);
    iVar1 = yyparse();
    if (iVar1 == 0) {
      iVar1 = RM_FileHandle::GetRec(&this->fh,&local_30,rec);
      bVar3 = iVar1 == 0;
    }
    else {
      bVar3 = false;
    }
    RID::~RID(&local_30);
    if (!bVar3) {
      return iVar1;
    }
  }
  else {
    RVar2 = RM_FileScan::GetNextRec(&this->fs,rec);
    if (RVar2 != 0) {
      return RVar2;
    }
  }
  RVar2 = RM_Record::GetData(rec,recData);
  return RVar2;
}

Assistant:

RC QL_NodeRel::RetrieveNextRec(RM_Record &rec, char *&recData){
  RC rc = 0;
  if(useIndex){
    RID rid;
    if((rc = is.GetNextEntry(rid) ))
      return (rc);
    if((rc = fh.GetRec(rid, rec) ))
      return (rc);
  }
  else{
    if((rc = fs.GetNextRec(rec)))
      return (rc);
  }
  if((rc = rec.GetData(recData)))
    return (rc);
  return (0);
}